

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O3

void __thiscall miniros::NodeHandle::construct(NodeHandle *this,string *ns,bool validate_name)

{
  element_type *peVar1;
  string *name;
  bool bVar2;
  int iVar3;
  NodeHandleBackingCollection *__s;
  TopicManagerPtr *pTVar4;
  ServiceManagerPtr *pSVar5;
  string local_78;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  string *local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar2 = isInitialized();
  if (!bVar2) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (construct::loc.initialized_ == false) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"miniros.unknown_package","");
      console::initializeLogLocation(&construct::loc,&local_78,Fatal);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    if (construct::loc.level_ != Fatal) {
      construct();
    }
    if (construct::loc.logger_enabled_ == true) {
      construct();
    }
  }
  __s = (NodeHandleBackingCollection *)operator_new(0xa8);
  pTVar4 = TopicManager::instance();
  local_58 = (pTVar4->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50._M_pi =
       (pTVar4->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  local_48 = ns;
  pSVar5 = ServiceManager::instance();
  peVar1 = (pSVar5->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (pSVar5->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
       ._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  local_40 = peVar1;
  memset(__s,0,0xa8);
  (__s->keep_alive_topic_manager).
  super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__s->keep_alive_topic_manager).
              super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_50);
  (__s->keep_alive_service_manager).
  super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__s->keep_alive_service_manager).
              super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  this->collection_ = __s;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  name = local_48;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  std::__cxx11::string::_M_assign((string *)&this->unresolved_namespace_);
  if (validate_name) {
    resolveName(&local_78,this,name,true);
  }
  else {
    resolveName();
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  this->ok_ = true;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)g_nh_refcount_mutex);
  if (iVar3 == 0) {
    if (g_nh_refcount == 0) {
      bVar2 = isStarted();
      if (!bVar2) {
        g_node_started_by_nh = 1;
        miniros::start();
      }
    }
    g_nh_refcount = g_nh_refcount + 1;
    pthread_mutex_unlock((pthread_mutex_t *)g_nh_refcount_mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void NodeHandle::construct(const std::string& ns, bool validate_name)
{
  if (!miniros::isInitialized())
  {
    MINIROS_FATAL("You must call miniros::init() before creating the first NodeHandle");
    MINIROS_BREAK();
  }

  collection_ = new NodeHandleBackingCollection(getTopicManager(), getServiceManager());
  unresolved_namespace_ = ns;
  // if callback_queue_ is nonnull, we are in a non-nullary constructor

  if (validate_name)
    namespace_ = resolveName(ns, true);
  else
    {
      namespace_ = resolveName(ns, true, no_validate());
      // FIXME validate namespace_ now
    }
  ok_ = true;

  std::scoped_lock<std::mutex> lock(g_nh_refcount_mutex);

  if (g_nh_refcount == 0 && !miniros::isStarted())
  {
    g_node_started_by_nh = true;
    miniros::start();
  }

  ++g_nh_refcount;
}